

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::FilenameIdentifier
                   (string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  byte *pbVar4;
  char local_58 [8];
  char buffer [32];
  int local_20;
  int i;
  string *filename_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_20 = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_20 < uVar2;
      local_20 = local_20 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)filename);
    bVar1 = ascii_isalnum(*pcVar3);
    if (bVar1) {
      std::__cxx11::string::operator[]((ulong)filename);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)filename);
      FastHexToBuffer((uint)*pbVar4,local_58);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string FilenameIdentifier(const string& filename) {
  string result;
  for (int i = 0; i < filename.size(); i++) {
    if (ascii_isalnum(filename[i])) {
      result.push_back(filename[i]);
    } else {
      // Not alphanumeric.  To avoid any possibility of name conflicts we
      // use the hex code for the character.
      result.push_back('_');
      char buffer[kFastToBufferSize];
      result.append(FastHexToBuffer(static_cast<uint8>(filename[i]), buffer));
    }
  }
  return result;
}